

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
 pybind11::detail::all_type_info_get_cache(PyTypeObject *type)

{
  internals *piVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  _object *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
  pVar3;
  pair<std::__detail::_Node_iterator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false,_false>,_bool>
  res;
  object *in_stack_ffffffffffffff48;
  vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
  *in_stack_ffffffffffffff50;
  unordered_map<_typeobject_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>,_std::hash<_typeobject_*>,_std::equal_to<_typeobject_*>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>_>
  *f;
  unordered_map<_typeobject_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>,_std::hash<_typeobject_*>,_std::equal_to<_typeobject_*>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>_>
  *this;
  handle in_stack_ffffffffffffff88;
  handle local_68 [2];
  _Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
  local_58;
  undefined1 local_50;
  undefined1 local_38 [40];
  _Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
  local_10;
  byte local_8;
  
  local_38._32_8_ = in_RDI;
  piVar1 = get_internals();
  f = &piVar1->registered_types_py;
  local_38._0_8_ = (__buckets_ptr)0x0;
  local_38._8_8_ = 0;
  local_38._16_8_ = (_Hash_node_base *)0x0;
  this = (unordered_map<_typeobject_*,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>,_std::hash<_typeobject_*>,_std::equal_to<_typeobject_*>,_std::allocator<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>_>_>
          *)local_38;
  std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>::vector
            ((vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>
              *)0x112816);
  pVar3 = std::
          unordered_map<_typeobject*,std::vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>>,std::hash<_typeobject*>,std::equal_to<_typeobject*>,std::allocator<std::pair<_typeobject*const,std::vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>>>>>
          ::
          emplace<_typeobject*&,std::vector<pybind11::detail::type_info*,std::allocator<pybind11::detail::type_info*>>>
                    (this,(_typeobject **)f,in_stack_ffffffffffffff50);
  local_58._M_cur =
       (__node_type *)
       pVar3.first.
       super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
       ._M_cur;
  local_50 = pVar3.second;
  local_10._M_cur = local_58._M_cur;
  local_8 = local_50;
  std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>::
  ~vector((vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_> *)
          this);
  uVar2 = extraout_RDX;
  if ((local_8 & 1) != 0) {
    handle::handle<_object_*,_0>(local_68,(_object *)local_38._32_8_);
    cpp_function::
    cpp_function<pybind11::detail::all_type_info_get_cache(_typeobject*)::_lambda(pybind11::handle)_1_,,void>
              ((cpp_function *)this,(type *)f);
    weakref::weakref((weakref *)local_38._32_8_,in_stack_ffffffffffffff88,in_stack_ffffffffffffff88)
    ;
    object::release(in_stack_ffffffffffffff48);
    weakref::~weakref((weakref *)0x1128f0);
    cpp_function::~cpp_function((cpp_function *)0x1128fa);
    uVar2 = extraout_RDX_00;
  }
  pVar3._9_7_ = (undefined7)((ulong)uVar2 >> 8);
  pVar3.second = (bool)local_8;
  pVar3.first.
  super__Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
             )(_Node_iterator_base<std::pair<_typeobject_*const,_std::vector<pybind11::detail::type_info_*,_std::allocator<pybind11::detail::type_info_*>_>_>,_false>
               )local_10._M_cur;
  return pVar3;
}

Assistant:

inline std::pair<decltype(internals::registered_types_py)::iterator, bool>
all_type_info_get_cache(PyTypeObject *type) {
    auto res = get_internals()
                   .registered_types_py
#ifdef __cpp_lib_unordered_map_try_emplace
                   .try_emplace(type);
#else
                   .emplace(type, std::vector<detail::type_info *>());
#endif
    if (res.second) {
        // New cache entry created; set up a weak reference to automatically remove it if the type
        // gets destroyed:
        weakref((PyObject *) type, cpp_function([type](handle wr) {
                    get_internals().registered_types_py.erase(type);

                    // TODO consolidate the erasure code in pybind11_meta_dealloc() in class.h
                    auto &cache = get_internals().inactive_override_cache;
                    for (auto it = cache.begin(), last = cache.end(); it != last;) {
                        if (it->first == reinterpret_cast<PyObject *>(type)) {
                            it = cache.erase(it);
                        } else {
                            ++it;
                        }
                    }

                    wr.dec_ref();
                }))
            .release();
    }

    return res;
}